

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O0

Report * __thiscall
SimpleStrategy::compareCFGs(Report *__return_storage_ptr__,SimpleStrategy *this,CFG *a,CFG *b)

{
  int iVar1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar2;
  size_type sVar3;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *psVar4;
  size_type sVar5;
  size_type sVar6;
  undefined1 local_560 [8];
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> callsAB;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> callsB;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> callsA;
  set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> edgesAB;
  set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> edgesB;
  set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> edgesA;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> phantomsAB;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> phantomsB;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> phantomsA;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> blocksAB;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> blocksB;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> blocksA;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> instrsAB;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> instrsB;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> instrsA;
  CfgData dataB;
  undefined1 local_158 [8];
  CfgData dataA;
  CFG *b_local;
  CFG *a_local;
  SimpleStrategy *this_local;
  Report *r;
  
  dataA.m_indirects._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  Report::Report(__return_storage_ptr__);
  CfgData::CfgData((CfgData *)local_158,a);
  CfgData::CfgData((CfgData *)&instrsA._M_t._M_impl.super__Rb_tree_header._M_node_count,b);
  (__return_storage_ptr__->matched).cfgs = 1;
  (__return_storage_ptr__->unmatched).a.cfgs = 0;
  (__return_storage_ptr__->unmatched).b.cfgs = 0;
  psVar2 = CfgData::instrs((CfgData *)local_158);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &instrsB._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar2);
  psVar2 = CfgData::instrs((CfgData *)&instrsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &instrsAB._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar2);
  matchGeneric<unsigned_long>
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &blocksA._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &instrsB._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &instrsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&blocksA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->matched).instrs = (int)sVar3;
  sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&instrsB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).a.instrs = (int)sVar3;
  sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&instrsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).b.instrs = (int)sVar3;
  psVar4 = CfgData::blocks((CfgData *)local_158);
  std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::set
            ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &blocksB._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar4);
  psVar4 = CfgData::blocks((CfgData *)&instrsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::set
            ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &blocksAB._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar4);
  matchGeneric<CfgData::Node>
            ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &phantomsA._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
             (set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &blocksB._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &blocksAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar5 = std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::size
                    ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *
                     )&phantomsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->matched).blocks = (int)sVar5;
  sVar5 = std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::size
                    ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *
                     )&blocksB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).a.blocks = (int)sVar5;
  sVar5 = std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::size
                    ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *
                     )&blocksAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).b.blocks = (int)sVar5;
  psVar2 = CfgData::phantoms((CfgData *)local_158);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &phantomsB._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar2);
  psVar2 = CfgData::phantoms((CfgData *)&instrsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &phantomsAB._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar2);
  matchGeneric<unsigned_long>
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &edgesA._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &phantomsB._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &phantomsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&edgesA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->matched).phantoms = (int)sVar3;
  sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&phantomsB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).a.phantoms = (int)sVar3;
  sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&phantomsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).b.phantoms = (int)sVar3;
  CfgData::edges((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
                 &edgesB._M_t._M_impl.super__Rb_tree_header._M_node_count,(CfgData *)local_158);
  CfgData::edges((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
                 &edgesAB._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (CfgData *)&instrsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  matchGeneric<CfgData::Edge>
            ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             &callsA._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
             (set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             &edgesB._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             &edgesAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar6 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::size
                    ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *
                     )&callsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->matched).edges = (int)sVar6;
  sVar6 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::size
                    ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *
                     )&edgesB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).a.edges = (int)sVar6;
  sVar6 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::size
                    ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *
                     )&edgesAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).b.edges = (int)sVar6;
  CfgData::calls((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
                 &callsB._M_t._M_impl.super__Rb_tree_header._M_node_count,(CfgData *)local_158);
  CfgData::calls((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
                 &callsAB._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (CfgData *)&instrsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  matchCalls((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             local_560,this,
             (set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             &callsB._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             &callsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  iVar1 = countCalls(this,(set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
                           *)local_560);
  (__return_storage_ptr__->matched).calls = iVar1;
  iVar1 = countCalls(this,(set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
                           *)&callsB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).a.calls = iVar1;
  iVar1 = countCalls(this,(set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
                           *)&callsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (__return_storage_ptr__->unmatched).b.calls = iVar1;
  dataA.m_indirects._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::~set
            ((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             local_560);
  std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::~set
            ((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             &callsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::~set
            ((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             &callsB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::~set
            ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             &callsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::~set
            ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             &edgesAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::~set
            ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             &edgesB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &edgesA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &phantomsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &phantomsB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::~set
            ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &phantomsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::~set
            ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &blocksAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::~set
            ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &blocksB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &blocksA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &instrsAB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &instrsB._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CfgData::~CfgData((CfgData *)&instrsA._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CfgData::~CfgData((CfgData *)local_158);
  if ((dataA.m_indirects._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    Report::~Report(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SimpleStrategy::Report SimpleStrategy::compareCFGs(CFG* a, CFG* b) {
	SimpleStrategy::Report r;

	CfgData dataA(a);
	CfgData dataB(b);

	r.matched.cfgs = 1;
	r.unmatched.a.cfgs = 0;
	r.unmatched.b.cfgs = 0;

	std::set<Addr> instrsA = dataA.instrs();
	std::set<Addr> instrsB = dataB.instrs();
	std::set<Addr> instrsAB = matchGeneric(instrsA, instrsB);
	r.matched.instrs = instrsAB.size();
	r.unmatched.a.instrs = instrsA.size();
	r.unmatched.b.instrs = instrsB.size();

	std::set<CfgData::Node> blocksA = dataA.blocks();
	std::set<CfgData::Node> blocksB = dataB.blocks();
	std::set<CfgData::Node> blocksAB = matchGeneric(blocksA, blocksB);
	r.matched.blocks = blocksAB.size();
	r.unmatched.a.blocks = blocksA.size();
	r.unmatched.b.blocks = blocksB.size();

	std::set<Addr> phantomsA = dataA.phantoms();
	std::set<Addr> phantomsB = dataB.phantoms();
	std::set<Addr> phantomsAB = matchGeneric(phantomsA, phantomsB);
	r.matched.phantoms = phantomsAB.size();
	r.unmatched.a.phantoms = phantomsA.size();
	r.unmatched.b.phantoms = phantomsB.size();

	std::set<CfgData::Edge> edgesA = dataA.edges();
	std::set<CfgData::Edge> edgesB = dataB.edges();
	std::set<CfgData::Edge> edgesAB = matchGeneric(edgesA, edgesB);
	r.matched.edges = edgesAB.size();
	r.unmatched.a.edges = edgesA.size();
	r.unmatched.b.edges = edgesB.size();

	std::set<CfgData::Call> callsA = dataA.calls();
	std::set<CfgData::Call> callsB = dataB.calls();
	std::set<CfgData::Call> callsAB = matchCalls(callsA, callsB);
	r.matched.calls = countCalls(callsAB);
	r.unmatched.a.calls = countCalls(callsA);
	r.unmatched.b.calls = countCalls(callsB);

	return r;
}